

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

float __thiscall lda::digamma(lda *this,float x)

{
  lda_math_mode lVar1;
  float fVar2;
  ostream *poVar3;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_29;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  lVar1 = this->mmode;
  if (lVar1 != USE_SIMD) {
    if (lVar1 == USE_PRECISE) {
      local_18._0_8_ =
           boost::math::detail::
           digamma_imp<double,boost::integral_constant<int,24>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                     ((double)x,(integral_constant<int,_24> *)0x0,&local_29);
      local_18._8_4_ = extraout_XMM0_Dc;
      local_18._12_4_ = extraout_XMM0_Dd;
      local_28._0_8_ = ABS((double)local_18._0_8_);
      local_28._8_4_ = extraout_XMM0_Dc;
      local_28._12_4_ = extraout_XMM0_Dd & 0x7fffffff;
      fVar2 = 0.0;
      if (3.4028234663852886e+38 < (double)local_28._0_8_) {
        boost::math::policies::detail::raise_error<std::overflow_error,float>
                  ("boost::math::digamma<%1%>(%1%)","numeric overflow");
        fVar2 = (float)(double)local_18._0_8_;
      }
      if (3.4028234663852886e+38 < (double)local_28._0_8_) {
        return fVar2;
      }
      return (float)(double)local_18._0_8_;
    }
    if (lVar1 != USE_FAST_APPROX) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "lda::digamma: Trampled or invalid math mode, aborting");
      std::endl<char,std::char_traits<char>>(poVar3);
      abort();
    }
  }
  fVar4 = x + 2.0;
  fVar2 = (float)((uint)fVar4 & 0x7fffff | 0x3f000000);
  auVar5._4_12_ = DAT_002782e0._4_12_;
  auVar5._0_4_ = x * 6.0 + 13.0;
  auVar6._4_4_ = fVar2 + 0.35208872;
  auVar6._0_4_ = fVar4 * 12.0 * fVar4;
  auVar6._8_8_ = 0;
  auVar6 = divps(auVar5,auVar6);
  return ((fVar2 * -1.4980303 + (float)(uint)fVar4 * 1.1920929e-07 + -124.22545) - auVar6._4_4_) *
         0.6931472 + (-(x + x + 1.0) / ((x + 1.0) * x) - auVar6._0_4_);
}

Assistant:

float lda::digamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::digamma FAST_APPROX ";
      return ldamath::digamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::digamma PRECISE ";
      return ldamath::digamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::digamma SIMD ";
      return ldamath::digamma<float, USE_SIMD>(x);
    default:
      // Should not happen.
      std::cerr << "lda::digamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}